

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O0

void __thiscall
QHttpThreadDelegate::synchronousAuthenticationRequiredSlot
          (QHttpThreadDelegate *this,QHttpNetworkRequest *request,QAuthenticator *a)

{
  long lVar1;
  bool bVar2;
  QNetworkAuthenticationCredential *this_00;
  QHttpNetworkRequest *in_RDI;
  long in_FS_OFFSET;
  QNetworkAuthenticationCredential credential;
  QString *in_stack_ffffffffffffff78;
  QUrl local_58;
  undefined1 local_50 [32];
  QAuthenticator *in_stack_ffffffffffffffd0;
  QUrl *in_stack_ffffffffffffffd8;
  QNetworkAccessAuthenticationManager *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI[0x15].super_QHttpNetworkHeader._vptr_QHttpNetworkHeader != (_func_int **)0x0) {
    memset(local_50,0xaa,0x48);
    this_00 = (QNetworkAuthenticationCredential *)
              std::
              __shared_ptr_access<QNetworkAccessAuthenticationManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<QNetworkAccessAuthenticationManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x310956);
    QHttpNetworkRequest::url(in_RDI);
    QNetworkAccessAuthenticationManager::fetchCachedCredentials
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    QUrl::~QUrl(&local_58);
    bVar2 = QNetworkAuthenticationCredential::isNull(this_00);
    if (!bVar2) {
      QAuthenticator::setUser((QAuthenticator *)this_00,in_stack_ffffffffffffff78);
      QAuthenticator::setPassword((QAuthenticator *)this_00,in_stack_ffffffffffffff78);
    }
    QObject::disconnect((QObject *)in_RDI[0x15].super_QHttpNetworkHeader._vptr_QHttpNetworkHeader,
                        "2authenticationRequired(QHttpNetworkRequest,QAuthenticator*)",
                        (QObject *)in_RDI,
                        "1synchronousAuthenticationRequiredSlot(QHttpNetworkRequest,QAuthenticator*)"
                       );
    QNetworkAuthenticationCredential::~QNetworkAuthenticationCredential(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttpThreadDelegate::synchronousAuthenticationRequiredSlot(const QHttpNetworkRequest &request, QAuthenticator *a)
{
    if (!httpReply)
        return;

    Q_UNUSED(request);
#ifdef QHTTPTHREADDELEGATE_DEBUG
    qDebug() << "QHttpThreadDelegate::synchronousAuthenticationRequiredSlot() thread=" << QThread::currentThreadId();
#endif

    // Ask the credential cache
    QNetworkAuthenticationCredential credential = authenticationManager->fetchCachedCredentials(httpRequest.url(), a);
    if (!credential.isNull()) {
        a->setUser(credential.user);
        a->setPassword(credential.password);
    }

    // Disconnect this connection now since we only want to ask the authentication cache once.
    QObject::disconnect(httpReply, SIGNAL(authenticationRequired(QHttpNetworkRequest,QAuthenticator*)),
        this, SLOT(synchronousAuthenticationRequiredSlot(QHttpNetworkRequest,QAuthenticator*)));
}